

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QMDP *this_00;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005d9ff0;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005d98f8);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005d9850,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5d9680;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5d97c8;
  this_00 = (QMDP *)operator_new(0x70);
  QMDP::QMDP(this_00,&puf->super_PlanningUnitDecPOMDPDiscrete,false);
  this->_m_QMDP = this_00;
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}